

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fire::arg::_convert<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,arg *this,bool dec_main_argc)

{
  bool pass;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> val;
  bool dec_main_argc_local;
  arg *this_local;
  
  val._39_1_ = dec_main_argc;
  _get_with_precision<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_48,this);
  pass = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_48);
  identifier::longer_abi_cxx11_(&local_a8,&this->_id);
  std::operator+(&local_88,"required argument ",&local_a8);
  std::operator+(&local_68,&local_88," not provided");
  _matcher::deferred_assert((_matcher *)_storage<void>::matcher,&this->_id,pass,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  _matcher::check((_matcher *)_storage<void>::matcher,(bool)(val._39_1_ & 1));
  std::__cxx11::string::string((string *)&local_d8);
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  value_or(__return_storage_ptr__,
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_48,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_48);
  return __return_storage_ptr__;
}

Assistant:

T arg::_convert(bool dec_main_argc) {
        optional<T> val = _get_with_precision<T>();
        _::matcher.deferred_assert(_id, val.has_value(),
                                   "required argument " + _id.longer() + " not provided");
        _::matcher.check(dec_main_argc);
        return val.value_or(T());
    }